

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O3

void NJDNode_clear(NJDNode *node)

{
  if (node->string != (char *)0x0) {
    free(node->string);
    node->string = (char *)0x0;
  }
  if (node->pos != (char *)0x0) {
    free(node->pos);
    node->pos = (char *)0x0;
  }
  if (node->pos_group1 != (char *)0x0) {
    free(node->pos_group1);
    node->pos_group1 = (char *)0x0;
  }
  if (node->pos_group2 != (char *)0x0) {
    free(node->pos_group2);
    node->pos_group2 = (char *)0x0;
  }
  if (node->pos_group3 != (char *)0x0) {
    free(node->pos_group3);
    node->pos_group3 = (char *)0x0;
  }
  if (node->ctype != (char *)0x0) {
    free(node->ctype);
    node->ctype = (char *)0x0;
  }
  if (node->cform != (char *)0x0) {
    free(node->cform);
    node->cform = (char *)0x0;
  }
  if (node->orig != (char *)0x0) {
    free(node->orig);
    node->orig = (char *)0x0;
  }
  if (node->read != (char *)0x0) {
    free(node->read);
    node->read = (char *)0x0;
  }
  if (node->pron != (char *)0x0) {
    free(node->pron);
    node->pron = (char *)0x0;
  }
  node->acc = 0;
  node->mora_size = 0;
  if (node->chain_rule != (char *)0x0) {
    free(node->chain_rule);
    node->chain_rule = (char *)0x0;
  }
  node->chain_flag = -1;
  node->prev = (_NJDNode *)0x0;
  node->next = (_NJDNode *)0x0;
  return;
}

Assistant:

void NJDNode_clear(NJDNode * node)
{
   if (node->string != NULL) {
      free(node->string);
      node->string = NULL;
   }
   if (node->pos != NULL) {
      free(node->pos);
      node->pos = NULL;
   }
   if (node->pos_group1 != NULL) {
      free(node->pos_group1);
      node->pos_group1 = NULL;
   }
   if (node->pos_group2 != NULL) {
      free(node->pos_group2);
      node->pos_group2 = NULL;
   }
   if (node->pos_group3 != NULL) {
      free(node->pos_group3);
      node->pos_group3 = NULL;
   }
   if (node->ctype != NULL) {
      free(node->ctype);
      node->ctype = NULL;
   }
   if (node->cform != NULL) {
      free(node->cform);
      node->cform = NULL;
   }
   if (node->orig != NULL) {
      free(node->orig);
      node->orig = NULL;
   }
   if (node->read != NULL) {
      free(node->read);
      node->read = NULL;
   }
   if (node->pron != NULL) {
      free(node->pron);
      node->pron = NULL;
   }
   node->acc = 0;
   node->mora_size = 0;
   if (node->chain_rule != NULL) {
      free(node->chain_rule);
      node->chain_rule = NULL;
   }
   node->chain_flag = -1;
   node->prev = NULL;
   node->next = NULL;
}